

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

bool __thiscall slang::ast::Scope::handleDataDeclaration(Scope *this,DataDeclarationSyntax *syntax)

{
  DeferredMemberIndex DVar1;
  SymbolKind SVar2;
  NamedTypeSyntax *syntax_00;
  Compilation *this_00;
  size_t sVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  NetType *args_2;
  DeclaratorSyntax *pDVar4;
  NetSymbol *this_01;
  DeferredMemberData *this_02;
  Scope *pSVar5;
  bitmask<slang::ast::LookupFlags> in_R8D;
  string_view lookupName;
  SourceRange sourceRange;
  string_view name;
  const_iterator __begin3;
  DefinitionLookupResult local_68;
  ConfigBlockSymbol *local_50;
  SourceLocation local_48;
  string_view local_40;
  
  syntax_00 = (NamedTypeSyntax *)(syntax->type).ptr;
  lookupName = getIdentifierName(syntax_00);
  name._M_len = lookupName._M_str;
  if ((Scope *)lookupName._M_len != (Scope *)0x0) {
    DVar1 = this->deferredMemberIndex;
    this->deferredMemberIndex = Invalid;
    name._M_str = (char *)0x0;
    args_2 = (NetType *)Lookup::unqualified((Lookup *)this,(Scope *)lookupName._M_len,name,in_R8D);
    this->deferredMemberIndex = DVar1;
    if (args_2 == (NetType *)0x0) {
      if ((((((syntax_00->name).ptr)->super_ExpressionSyntax).super_SyntaxNode.kind ==
            IdentifierName) &&
          (Compilation::tryGetDefinition(&local_68,this->compilation,lookupName,this),
          local_68.definition != (Symbol *)0x0)) && ((local_68.definition)->kind == Definition)) {
        if ((((int)local_68.definition[1].name._M_len == 1) && (this->thisSym->kind == InstanceBody)
            ) && (this->thisSym[2].name._M_str[0x2d8] == '\x01')) {
          addDeferredMembers(this,(SyntaxNode *)syntax);
          this_02 = getOrAddDeferredData(this);
          DeferredMemberData::addPortDeclaration(this_02,(SyntaxNode *)syntax,this->lastMember);
          return true;
        }
        local_68.configRoot = (ConfigBlockSymbol *)0x0;
        sVar3 = (syntax->declarators).elements._M_extent._M_extent_value;
        local_68.definition = (Symbol *)&syntax->declarators;
        while( true ) {
          if ((local_68.definition == (Symbol *)&syntax->declarators) &&
             (local_68.configRoot == (ConfigBlockSymbol *)(sVar3 + 1 >> 1))) {
            addDeferredMembers(this,(SyntaxNode *)syntax);
            return true;
          }
          pDVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                   iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference
                             ((iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)&local_68);
          if (pDVar4->initializer != (EqualsValueClauseSyntax *)0x0) break;
          local_68.configRoot =
               (ConfigBlockSymbol *)((long)&((local_68.configRoot)->super_Symbol).kind + 1);
        }
      }
    }
    else if ((args_2->super_Symbol).kind == NetType) {
      local_68.configRoot = (ConfigBlockSymbol *)0x0;
      local_50 = (ConfigBlockSymbol *)
                 ((syntax->declarators).elements._M_extent._M_extent_value + 1 >> 1);
      local_68.definition = (Symbol *)&syntax->declarators;
      for (; (local_68.definition != (Symbol *)&syntax->declarators ||
             (pSVar5 = this, local_68.configRoot != local_50));
          local_68.configRoot =
               (ConfigBlockSymbol *)((long)&((local_68.configRoot)->super_Symbol).kind + 1)) {
        pDVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                 iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference
                           ((iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)&local_68);
        this_00 = this->compilation;
        local_40 = parsing::Token::valueText(&pDVar4->name);
        local_48 = parsing::Token::location(&pDVar4->name);
        this_01 = BumpAllocator::
                  emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                            (&this_00->super_BumpAllocator,&local_40,&local_48,args_2);
        ValueSymbol::setFromDeclarator(&this_01->super_ValueSymbol,pDVar4);
        syntax_01._M_ptr =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_01._M_extent._M_extent_value =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        Symbol::setAttributes((Symbol *)this_01,this,syntax_01);
        addMember(this,(Symbol *)this_01);
      }
      while( true ) {
        SVar2 = pSVar5->thisSym->kind;
        if (SVar2 == InstanceBody) {
          return true;
        }
        if (SVar2 == CheckerInstanceBody) break;
        pSVar5 = pSVar5->thisSym->parentScope;
        if (pSVar5 == (Scope *)0x0) {
          return true;
        }
      }
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      addDiag(this,(DiagCode)0x890005,sourceRange);
      return true;
    }
  }
  return false;
}

Assistant:

bool Scope::handleDataDeclaration(const DataDeclarationSyntax& syntax) {
    auto& namedType = syntax.type->as<NamedTypeSyntax>();
    std::string_view name = getIdentifierName(namedType);
    if (name.empty())
        return false;

    // We aren't elaborated yet so can't do a normal lookup in this scope.
    // Temporarily swap out the deferred member index so that the lookup
    // doesn't trigger elaboration.
    auto savedIndex = std::exchange(deferredMemberIndex, DeferredMemberIndex::Invalid);
    auto symbol = Lookup::unqualified(*this, name);
    deferredMemberIndex = savedIndex;

    // If we found a net type, this is actually one or more net symbols.
    if (symbol && symbol->kind == SymbolKind::NetType) {
        auto& netType = symbol->as<NetType>();
        for (auto decl : syntax.declarators) {
            auto net = compilation.emplace<NetSymbol>(decl->name.valueText(), decl->name.location(),
                                                      netType);
            net->setFromDeclarator(*decl);
            net->setAttributes(*this, syntax.attributes);
            addMember(*net);
        }

        // Make sure we're not declared within a checker.
        const Scope* currScope = this;
        do {
            auto& sym = currScope->asSymbol();
            if (sym.kind == SymbolKind::InstanceBody)
                break;

            if (sym.kind == SymbolKind::CheckerInstanceBody) {
                addDiag(diag::NotAllowedInChecker, syntax.sourceRange());
                break;
            }

            currScope = sym.getParentScope();
        } while (currScope);

        return true;
    }

    // No user-defined net type found. If this is a simple name and no symbol at all
    // was found we should continue on to see if this is a non-ansi interface port.
    if (symbol || namedType.name->kind != SyntaxKind::IdentifierName)
        return false;

    auto def = compilation.tryGetDefinition(name, *this).definition;
    if (!def || def->kind != SymbolKind::Definition)
        return false;

    // If we're in an instance and have non-ansi ports then assume that this is
    // a non-ansi interface port definition.
    if (def->as<DefinitionSymbol>().definitionKind == DefinitionKind::Interface &&
        asSymbol().kind == SymbolKind::InstanceBody &&
        asSymbol().as<InstanceBodySymbol>().getDefinition().hasNonAnsiPorts) {

        // Save for later when we process the ports.
        addDeferredMembers(syntax);
        getOrAddDeferredData().addPortDeclaration(syntax, lastMember);
        return true;
    }

    // If we made it this far it's probably a malformed instantiation -- the user forgot
    // to include the parentheses. Let's just treat it like an instantiation instead, as
    // long as there are no decl initializers (which would never look like an instantiation).
    for (auto decl : syntax.declarators) {
        if (decl->initializer)
            return false;
    }

    addDeferredMembers(syntax);
    return true;
}